

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O0

void Cut_NodeComputeCutsSeq
               (Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int nLat0,
               int nLat1,int fTriv,int CutSetNum)

{
  int iVar1;
  Cut_Cut_t *pCVar2;
  abctime aVar3;
  abctime aVar4;
  Cut_Cut_t *pCVar5;
  abctime clk;
  Cut_Cut_t *pListNew;
  Cut_List_t *pSuper;
  Cut_List_t Super;
  int fCompl1_local;
  int fCompl0_local;
  int Node1_local;
  int Node0_local;
  int Node_local;
  Cut_Man_t *p_local;
  
  Super.ppTail[0xc]._4_4_ = fCompl1;
  pCVar2 = Cut_NodeReadCutsOld(p,Node);
  iVar1 = Cut_CutCountList(pCVar2);
  p->nNodeCuts = iVar1;
  if (p->nNodeCuts < p->pParams->nKeepMax) {
    if (p->nNodeCuts == 0) {
      p->nNodes = p->nNodes + 1;
    }
    pCVar2 = Cut_NodeReadCutsOld(p,Node0);
    p->pStore0[0] = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node0);
    p->pStore0[1] = pCVar2;
    pCVar2 = Cut_NodeReadCutsOld(p,Node1);
    p->pStore1[0] = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node1);
    p->pStore1[1] = pCVar2;
    if (((Node == Node0) || (Node == Node1)) || (Node0 == Node1)) {
      pCVar2 = Cut_CutDupList(p,p->pStore0[0]);
      p->pStore0[0] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore0[1]);
      p->pStore0[1] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore1[0]);
      p->pStore1[0] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore1[1]);
      p->pStore1[1] = pCVar2;
    }
    if (nLat0 != 0) {
      Cut_NodeShiftCutLeaves(p->pStore0[0],nLat0);
      Cut_NodeShiftCutLeaves(p->pStore0[1],nLat0);
    }
    if (nLat1 != 0) {
      Cut_NodeShiftCutLeaves(p->pStore1[0],nLat1);
      Cut_NodeShiftCutLeaves(p->pStore1[1],nLat1);
    }
    pCVar2 = Cut_NodeReadCutsOld(p,Node);
    p->pCompareOld = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node);
    p->pCompareNew = pCVar2;
    aVar3 = Abc_Clock();
    Cut_ListStart((Cut_List_t *)&pSuper);
    Cut_NodeDoComputeCuts
              (p,(Cut_List_t *)&pSuper,Node,fCompl0,Super.ppTail[0xc]._4_4_,p->pStore0[0],
               p->pStore1[1],0,0);
    Cut_NodeDoComputeCuts
              (p,(Cut_List_t *)&pSuper,Node,fCompl0,Super.ppTail[0xc]._4_4_,p->pStore0[1],
               p->pStore1[0],0,0);
    Cut_NodeDoComputeCuts
              (p,(Cut_List_t *)&pSuper,Node,fCompl0,Super.ppTail[0xc]._4_4_,p->pStore0[1],
               p->pStore1[1],fTriv,0);
    pCVar2 = Cut_ListFinish((Cut_List_t *)&pSuper);
    aVar4 = Abc_Clock();
    p->timeMerge = (aVar4 - aVar3) + p->timeMerge;
    if (((Node == Node0) || (Node == Node1)) || (Node0 == Node1)) {
      Cut_CutRecycleList(p,p->pStore0[0]);
      Cut_CutRecycleList(p,p->pStore0[1]);
      Cut_CutRecycleList(p,p->pStore1[0]);
      Cut_CutRecycleList(p,p->pStore1[1]);
    }
    else {
      if (nLat0 != 0) {
        Cut_NodeShiftCutLeaves(p->pStore0[0],-nLat0);
        Cut_NodeShiftCutLeaves(p->pStore0[1],-nLat0);
      }
      if (nLat1 != 0) {
        Cut_NodeShiftCutLeaves(p->pStore1[0],-nLat1);
        Cut_NodeShiftCutLeaves(p->pStore1[1],-nLat1);
      }
    }
    if (CutSetNum < 0) {
      pCVar5 = Cut_NodeReadCutsNew(p,Node);
      if (pCVar5 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x91,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsNew(p,Node,pCVar2);
    }
    else {
      pCVar5 = Cut_NodeReadCutsTemp(p,CutSetNum);
      if (pCVar5 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x8c,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsTemp(p,CutSetNum,pCVar2);
    }
    if (p->pParams->nKeepMax <= p->nNodeCuts) {
      p->nCutsLimit = p->nCutsLimit + 1;
    }
  }
  return;
}

Assistant:

void Cut_NodeComputeCutsSeq( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int nLat0, int nLat1, int fTriv, int CutSetNum )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pListNew;
    abctime clk;
    
    // get the number of cuts at the node
    p->nNodeCuts = Cut_CutCountList( Cut_NodeReadCutsOld(p, Node) );
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        return;

    // count only the first visit
    if ( p->nNodeCuts == 0 )
        p->nNodes++;

    // store the fanin lists
    p->pStore0[0] = Cut_NodeReadCutsOld( p, Node0 );
    p->pStore0[1] = Cut_NodeReadCutsNew( p, Node0 );
    p->pStore1[0] = Cut_NodeReadCutsOld( p, Node1 );
    p->pStore1[1] = Cut_NodeReadCutsNew( p, Node1 );

    // duplicate the cut lists if fanin nodes are non-standard
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        p->pStore0[0] = Cut_CutDupList( p, p->pStore0[0] );
        p->pStore0[1] = Cut_CutDupList( p, p->pStore0[1] );
        p->pStore1[0] = Cut_CutDupList( p, p->pStore1[0] );
        p->pStore1[1] = Cut_CutDupList( p, p->pStore1[1] );
    }

    // shift the cuts by as many latches and recompute signatures
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], nLat0 );
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], nLat0 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], nLat1 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], nLat1 );

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Node );
    p->pCompareNew = Cut_NodeReadCutsNew( p, Node );

    // merge the old and the new
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[0], p->pStore1[1], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[0], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[1], fTriv, 0 );
    pListNew = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;

    // shift the cuts by as many latches and recompute signatures
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        Cut_CutRecycleList( p, p->pStore0[0] );
        Cut_CutRecycleList( p, p->pStore0[1] );
        Cut_CutRecycleList( p, p->pStore1[0] );
        Cut_CutRecycleList( p, p->pStore1[1] );
    }
    else
    {
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], -nLat0 );
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], -nLat0 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], -nLat1 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], -nLat1 );
    }

    // set the lists at the node
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pListNew );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Node) == NULL );
        Cut_NodeWriteCutsNew( p, Node, pListNew );
    }

    // mark the node if we exceeded the number of cuts
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        p->nCutsLimit++;
}